

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvHandleFailure(CVodeMem cv_mem,int flag)

{
  int in_ESI;
  CVodeMem in_RDI;
  int local_4;
  
  local_4 = in_ESI;
  if (in_ESI == -9999) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x15,(char *)0x1fa7,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the nonlinear solver was passed a NULL input.");
  }
  else if (in_ESI == -0x3a) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x3a,(char *)0x1fbf,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg the projection function had repeated recoverable errors.");
  }
  else if (in_ESI == -0x39) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x39,(char *)0x1fbb,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg the projection function failed with an unrecoverable error.");
  }
  else if (in_ESI == -0x38) {
    cvProcessError(in_RDI,-0x38,0x1fb7,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"proj_mem = NULL illegal.");
  }
  else if (in_ESI == -0x36) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x36,(char *)0x1f98,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the quadrature sensitivity right-hand side failed in a recoverable manner, but no recovery is possible."
                  );
  }
  else if (in_ESI == -0x35) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x35,(char *)0x1f9c,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg repeated recoverable quadrature sensitivity right-hand side function errors."
                  );
  }
  else if (in_ESI == -0x33) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x33,(char *)0x1f94,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the quadrature sensitivity right-hand side routine failed in an unrecoverable manner."
                  );
  }
  else if (in_ESI == -0x2c) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x2c,(char *)0x1f8c,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the sensitivity right-hand side failed in a recoverable manner, but no recovery is possible."
                  );
  }
  else if (in_ESI == -0x2b) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x2b,(char *)0x1f90,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg repeated recoverable sensitivity right-hand side function errors.");
  }
  else if (in_ESI == -0x29) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x29,(char *)0x1f88,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the sensitivity right-hand side routine failed in an unrecoverable manner."
                  );
  }
  else if (in_ESI == -0x22) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x22,(char *)0x1f80,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the quadrature right-hand side failed in a recoverable manner, but no recovery is possible."
                  );
  }
  else if (in_ESI == -0x21) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x21,(char *)0x1f84,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg repeated recoverable quadrature right-hand side function errors.");
  }
  else if (in_ESI == -0x1f) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x1f,(char *)0x1f7c,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the quadrature right-hand side routine failed in an unrecoverable manner."
                  );
  }
  else if (in_ESI == -0x1b) {
    cvProcessError(in_RDI,-0x1b,0x1fa0,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"tout too close to t0 to start integration.");
  }
  else if (in_ESI == -0x15) {
    cvProcessError((CVodeMem)0x0,-0x15,0x1fa4,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else if (in_ESI == -0x10) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0x10,(char *)0x1fb3,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the nonlinear solver failed in an unrecoverable manner.");
  }
  else if (in_ESI == -0xf) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0xf,(char *)0x1faf,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, unable to satisfy inequality constraints.");
  }
  else if (in_ESI == -0xe) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0xe,(char *)0x1fab,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the nonlinear solver setup failed unrecoverably.");
  }
  else if (in_ESI == -0xc) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0xc,(char *)0x1f78,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -0xb) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-0xb,(char *)0x1f70,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible."
                  );
  }
  else if (in_ESI == -10) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-10,(char *)0x1f74,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg repeated recoverable right-hand side function errors.");
  }
  else if (in_ESI == -8) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-8,(char *)0x1f6c,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -7) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-7,(char *)0x1f68,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the solve routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -6) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,-6,(char *)0x1f64,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg, the setup routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -4) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI->cv_h,(int)in_RDI,(char *)0xfffffffc,
                   (char *)0x1f60,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "At t = %lg and h = %lg, the corrector convergence test failed repeatedly or with |h| = hmin."
                  );
  }
  else if (in_ESI == -3) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI->cv_h,(int)in_RDI,(char *)0xfffffffd,
                   (char *)0x1f5c,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.");
  }
  else {
    cvProcessError(in_RDI,-99,0x1fc4,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,
                   "CVODES encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
                  );
    local_4 = -99;
  }
  return local_4;
}

Assistant:

static int cvHandleFailure(CVodeMem cv_mem, int flag)
{
  /* Set vector of  absolute weighted local errors */
  /*
  N_VProd(acor, ewt, tempv);
  N_VAbs(tempv, tempv);
  */

  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case CV_ERR_FAILURE:
    cvProcessError(cv_mem, CV_ERR_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_ERR_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_CONV_FAILURE:
    cvProcessError(cv_mem, CV_CONV_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_CONV_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_LSETUP_FAIL:
    cvProcessError(cv_mem, CV_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_LSOLVE_FAIL:
    cvProcessError(cv_mem, CV_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SOLVE_FAILED, cv_mem->cv_tn);
    break;
  case CV_RHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_RTFUNC_FAIL:
    cvProcessError(cv_mem, CV_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_QRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_QRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_QRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_QRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_QRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_QRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_SRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_SRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_SRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_SRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_SRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_SRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_QSRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_QSRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_QSRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_QSRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_QSRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_QSRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_TOO_CLOSE:
    cvProcessError(cv_mem, CV_TOO_CLOSE, __LINE__, __func__, __FILE__,
                   MSGCV_TOO_CLOSE);
    break;
  case CV_MEM_NULL:
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    break;
  case SUN_ERR_ARG_CORRUPT:
    cvProcessError(cv_mem, CV_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INPUT_NULL, cv_mem->cv_tn);
    break;
  case CV_NLS_SETUP_FAIL:
    cvProcessError(cv_mem, CV_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_CONSTR_FAIL:
    cvProcessError(cv_mem, CV_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_FAILED_CONSTR, cv_mem->cv_tn);
    break;
  case CV_NLS_FAIL:
    cvProcessError(cv_mem, CV_NLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_FAIL, cv_mem->cv_tn);
    break;
  case CV_PROJ_MEM_NULL:
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJ_MEM_NULL);
    break;
  case CV_PROJFUNC_FAIL:
    cvProcessError(cv_mem, CV_PROJFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJFUNC_FAIL, cv_mem->cv_tn);
    break;
  case CV_REPTD_PROJFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_PROJFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSG_CV_REPTD_PROJFUNC_ERR, cv_mem->cv_tn);
    break;
  default:
    /* This return should never happen */
    cvProcessError(cv_mem, CV_UNRECOGNIZED_ERR, __LINE__, __func__,
                   __FILE__, "CVODES encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov");
    return (CV_UNRECOGNIZED_ERR);
  }

  return (flag);
}